

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_InternalSessionCache_Test::TestBody
          (SSLTest_InternalSessionCache_Test *this)

{
  long lVar1;
  void *pvVar2;
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var3;
  int iVar4;
  SSL_METHOD *meth;
  undefined1 auVar5 [8];
  uint32_t number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Head_base<0UL,_ssl_session_st_*,_false> *this_00;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar7;
  initializer_list<ssl_session_st_*> __l;
  initializer_list<ssl_session_st_*> __l_00;
  initializer_list<ssl_session_st_*> __l_01;
  initializer_list<ssl_session_st_*> __l_02;
  initializer_list<ssl_session_st_*> __l_03;
  UniquePtr<SSL_SESSION> session;
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_SESSION> collision;
  UniquePtr<SSL_CTX> ctx;
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  sessions;
  _Head_base<0UL,_ssl_session_st_*,_false> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  pointer local_88;
  _Head_base<0UL,_ssl_session_st_*,_false> local_80;
  undefined1 local_78 [32];
  size_type local_58;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  pointer local_38;
  
  meth = (SSL_METHOD *)TLS_method();
  local_50._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  local_48[0] = local_50._M_head_impl != (SSL_CTX *)0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_48,(AssertionResult *)0x3442d9,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa66,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
    }
    if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_40,pbStack_40);
    }
    goto LAB_001714ad;
  }
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = (pointer)0x0;
  number = 0;
  do {
    CreateTestSession((anon_unknown_0 *)&local_b0,number);
    lVar1 = CONCAT71(local_b0._M_head_impl._1_7_,local_b0._M_head_impl._0_1_);
    local_98[0] = (internal)(lVar1 != 0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (lVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_98,(AssertionResult *)0x35c794,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa6c,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      if ((SSL_SESSION *)local_80._M_head_impl != (SSL_SESSION *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
      this_00 = &local_b0;
      goto LAB_00171359;
    }
    std::
    vector<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>,std::allocator<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>>
    ::emplace_back<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
              ((vector<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>,std::allocator<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>>
                *)local_48,(unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_b0);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_b0);
    if (lVar1 == 0) goto LAB_001714a3;
    number = number + 1;
  } while (number != 10);
  SSL_CTX_sess_set_cache_size(local_50._M_head_impl,5);
  pbVar6 = pbStack_40;
  _Var3._M_head_impl = local_50._M_head_impl;
  for (auVar5 = local_48; local_50._M_head_impl = _Var3._M_head_impl,
      auVar5 != (undefined1  [8])pbVar6;
      auVar5 = (undefined1  [8])
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar5)->
                _M_string_length) {
    iVar4 = SSL_CTX_add_session((SSL_CTX *)_Var3._M_head_impl,
                                (SSL_SESSION *)
                                (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)auVar5)->_M_dataplus)._M_p);
    local_98[0] = (internal)(iVar4 != 0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_98,
                 (AssertionResult *)"SSL_CTX_add_session(ctx.get(), session.get())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa74,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_b0);
      goto LAB_0017145c;
    }
    _Var3._M_head_impl = local_50._M_head_impl;
  }
  local_78._0_8_ =
       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)local_48 + 0x40)
       )->_M_string_length;
  local_78._8_8_ =
       (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)local_48 + 0x40))->_M_dataplus)._M_p;
  local_78._16_8_ =
       *(long *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)local_48 + 0x20))->field_2 + 8);
  local_78._24_8_ =
       (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        ((long)local_48 + 0x20))->field_2)._M_allocated_capacity;
  local_58 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_48 + 0x20))->_M_string_length;
  __l._M_len = 5;
  __l._M_array = (iterator)local_78;
  std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
            ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l,
             (allocator_type *)&local_80);
  local_b0._M_head_impl._0_1_ =
       (anon_unknown_0)
       CacheEquals(_Var3._M_head_impl,
                   (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
  }
  if (local_b0._M_head_impl._0_1_ == (anon_unknown_0)0x0) {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_b0,
               (AssertionResult *)
               "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa7a,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_98);
LAB_001713c0:
    pdVar7 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
    }
    pbVar6 = local_a8;
    if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
      pbVar6 = local_a8;
    }
LAB_00171496:
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(pdVar7,pbVar6);
    }
  }
  else {
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    iVar4 = SSL_CTX_add_session((SSL_CTX *)local_50._M_head_impl,
                                *(SSL_SESSION **)
                                 ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)local_48 + 0x20))->field_2 + 8));
    _Var3._M_head_impl = local_50._M_head_impl;
    local_98[0] = (internal)(iVar4 == 0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_98[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_98,
                 (AssertionResult *)"SSL_CTX_add_session(ctx.get(), sessions[7].get())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa7e,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_b0);
LAB_0017145c:
      pdVar7 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_90;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      pbVar6 = local_90;
      if ((long *)CONCAT71(local_b0._M_head_impl._1_7_,local_b0._M_head_impl._0_1_) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(local_b0._M_head_impl._1_7_,local_b0._M_head_impl._0_1_) + 8)
        )();
        pbVar6 = local_90;
      }
      goto LAB_00171496;
    }
    local_78._0_8_ =
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)local_48 + 0x40))->_M_string_length;
    local_78._8_8_ =
         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)local_48 + 0x40))->_M_dataplus)._M_p;
    local_78._16_8_ =
         *(long *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)local_48 + 0x20))->field_2 + 8);
    local_78._24_8_ =
         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)local_48 + 0x20))->field_2)._M_allocated_capacity;
    local_58 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_48 + 0x20))->_M_string_length;
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)local_78;
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
              ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_00,
               (allocator_type *)&local_80);
    local_b0._M_head_impl._0_1_ =
         (anon_unknown_0)
         CacheEquals(_Var3._M_head_impl,
                     (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
    }
    if (local_b0._M_head_impl._0_1_ == (anon_unknown_0)0x0) {
      testing::Message::Message((Message *)local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_b0,
                 (AssertionResult *)
                 "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa81,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_98);
      goto LAB_001713c0;
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    CreateTestSession((anon_unknown_0 *)&local_80,7);
    local_98[0] = (internal)((SSL_SESSION *)local_80._M_head_impl != (SSL_SESSION *)0x0);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_SESSION *)local_80._M_head_impl == (SSL_SESSION *)0x0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)local_98,(AssertionResult *)"collision","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa86,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
LAB_00171992:
      pdVar7 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_90;
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      pbVar6 = local_90;
      if ((long *)CONCAT71(local_b0._M_head_impl._1_7_,local_b0._M_head_impl._0_1_) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(local_b0._M_head_impl._1_7_,local_b0._M_head_impl._0_1_) + 8)
        )();
        pbVar6 = local_90;
      }
    }
    else {
      iVar4 = SSL_CTX_add_session((SSL_CTX *)local_50._M_head_impl,
                                  (SSL_SESSION *)local_80._M_head_impl);
      _Var3._M_head_impl = local_50._M_head_impl;
      local_98[0] = (internal)(iVar4 != 0);
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)local_98,
                   (AssertionResult *)"SSL_CTX_add_session(ctx.get(), collision.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa87,(char *)local_78._0_8_);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        goto LAB_00171992;
      }
      local_78._0_8_ = local_80._M_head_impl;
      local_78._8_8_ =
           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_48 + 0x40))->_M_string_length;
      local_78._16_8_ =
           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)local_48 + 0x40))->_M_dataplus)._M_p;
      local_78._24_8_ =
           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)local_48 + 0x20))->field_2)._M_allocated_capacity;
      local_58 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_48 + 0x20))->_M_string_length;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)local_78;
      std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_01,
                 (allocator_type *)&local_a0);
      local_b0._M_head_impl._0_1_ =
           (anon_unknown_0)
           CacheEquals(_Var3._M_head_impl,
                       (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
      }
      if (local_b0._M_head_impl._0_1_ != (anon_unknown_0)0x0) {
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        iVar4 = SSL_CTX_remove_session
                          ((SSL_CTX *)local_50._M_head_impl,
                           (SSL_SESSION *)
                           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)local_48 + 0x20))->field_2)._M_allocated_capacity);
        _Var3._M_head_impl = local_50._M_head_impl;
        local_98[0] = (internal)(iVar4 != 0);
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_78,(internal *)local_98,
                     (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[6].get())",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xa8d,(char *)local_78._0_8_);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
        }
        else {
          local_78._0_8_ = local_80._M_head_impl;
          local_78._8_8_ =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_48 + 0x40))->_M_string_length;
          local_78._16_8_ =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_48 + 0x40))->_M_dataplus)._M_p;
          local_78._24_8_ =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_48 + 0x20))->_M_string_length;
          __l_02._M_len = 4;
          __l_02._M_array = (iterator)local_78;
          std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                    ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,__l_02,
                     (allocator_type *)&local_a0);
          local_b0._M_head_impl._0_1_ =
               (anon_unknown_0)
               CacheEquals(_Var3._M_head_impl,
                           (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98);
          local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
          }
          if (local_b0._M_head_impl._0_1_ == (anon_unknown_0)0x0) {
            testing::Message::Message((Message *)local_98);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_78,(internal *)&local_b0,
                       (AssertionResult *)
                       "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                       ,"false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xa8f,(char *)local_78._0_8_);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
            goto LAB_00171a2e;
          }
          if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,local_a8);
          }
          iVar4 = SSL_CTX_remove_session
                            ((SSL_CTX *)local_50._M_head_impl,
                             (SSL_SESSION *)((_Alloc_hider *)local_48)->_M_p);
          local_98[0] = (internal)(iVar4 == 0);
          local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_98[0]) {
            iVar4 = SSL_CTX_remove_session
                              ((SSL_CTX *)local_50._M_head_impl,
                               *(SSL_SESSION **)
                                ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)local_48 + 0x20))->field_2 + 8));
            _Var3._M_head_impl = local_50._M_head_impl;
            local_98[0] = (internal)(iVar4 == 0);
            local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_98[0]) {
              local_78._0_8_ = local_80._M_head_impl;
              local_78._8_8_ =
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_48 + 0x40))->_M_string_length;
              local_78._16_8_ =
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)local_48 + 0x40))->_M_dataplus)._M_p;
              local_78._24_8_ =
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_48 + 0x20))->_M_string_length;
              __l_03._M_len = 4;
              __l_03._M_array = (iterator)local_78;
              std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                        ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)local_98,
                         __l_03,(allocator_type *)&local_a0);
              local_b0._M_head_impl._0_1_ =
                   (anon_unknown_0)
                   CacheEquals(_Var3._M_head_impl,
                               (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)
                               local_98);
              local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              pvVar2 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,(long)local_88 - (long)pvVar2);
              }
              if (local_b0._M_head_impl._0_1_ == (anon_unknown_0)0x0) {
                testing::Message::Message((Message *)local_98);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_78,(internal *)&local_b0,
                           (AssertionResult *)
                           "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xa97,(char *)local_78._0_8_);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
                goto LAB_00171a2e;
              }
              goto LAB_00171a63;
            }
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_78,(internal *)local_98,
                       (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[7].get())",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xa93,(char *)local_78._0_8_);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
          }
          else {
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_78,(internal *)local_98,
                       (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[0].get())",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xa92,(char *)local_78._0_8_);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
          }
        }
        goto LAB_00171992;
      }
      testing::Message::Message((Message *)local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_b0,
                 (AssertionResult *)
                 "CacheEquals( ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[6].get(), sessions[5].get()})"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa8a,(char *)local_78._0_8_);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
LAB_00171a2e:
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((SSL_SESSION *)local_78._0_8_ != (SSL_SESSION *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
      }
      if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
      }
LAB_00171a63:
      pdVar7 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8;
      pbVar6 = local_a8;
    }
    if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(pdVar7,pbVar6);
    }
    this_00 = &local_80;
LAB_00171359:
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)this_00);
  }
LAB_001714a3:
  std::
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ::~vector((vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             *)local_48);
LAB_001714ad:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_50);
  return;
}

Assistant:

TEST(SSLTest, InternalSessionCache) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Prepare 10 test sessions.
  std::vector<bssl::UniquePtr<SSL_SESSION>> sessions;
  for (int i = 0; i < 10; i++) {
    bssl::UniquePtr<SSL_SESSION> session = CreateTestSession(i);
    ASSERT_TRUE(session);
    sessions.push_back(std::move(session));
  }

  SSL_CTX_sess_set_cache_size(ctx.get(), 5);

  // Insert all the test sessions.
  for (const auto &session : sessions) {
    ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), session.get()));
  }

  // Only the last five should be in the list.
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Inserting an element already in the cache should fail and leave the cache
  // unchanged.
  ASSERT_FALSE(SSL_CTX_add_session(ctx.get(), sessions[7].get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Although collisions should be impossible (256-bit session IDs), the cache
  // must handle them gracefully.
  bssl::UniquePtr<SSL_SESSION> collision(CreateTestSession(7));
  ASSERT_TRUE(collision);
  ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), collision.get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Removing sessions behaves correctly.
  ASSERT_TRUE(SSL_CTX_remove_session(ctx.get(), sessions[6].get()));
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));

  // Removing sessions requires an exact match.
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[0].get()));
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[7].get()));

  // The cache remains unchanged.
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));
}